

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriMemory.c
# Opt level: O1

void * uriDefaultReallocarray(UriMemoryManager *unused_memory,void *ptr,size_t nmemb,size_t size)

{
  void *pvVar1;
  
  pvVar1 = (void *)reallocarray(ptr,nmemb,size);
  return pvVar1;
}

Assistant:

static void * uriDefaultReallocarray(UriMemoryManager * URI_UNUSED(memory),
		void * ptr, size_t nmemb, size_t size) {
#ifdef HAVE_REALLOCARRAY
	return reallocarray(ptr, nmemb, size);
#else
	const size_t total_size = nmemb * size;

	URI_CHECK_ALLOC_OVERFLOW(total_size, nmemb, size);  /* may return */

	return realloc(ptr, total_size);
#endif
}